

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O0

void test_read_set_format(void)

{
  archive_entry *paVar1;
  char *file;
  char *pcVar2;
  archive_entry *paVar3;
  archive *a;
  archive_entry *ae;
  int size;
  char test_txt [21];
  char reffile [25];
  char buff [64];
  char *in_stack_00000350;
  archive_entry *in_stack_ffffffffffffff38;
  void *pvVar4;
  archive_entry **entry;
  archive *in_stack_ffffffffffffff40;
  uint uVar6;
  archive *paVar5;
  char *in_stack_ffffffffffffff48;
  char *v2;
  char *pcVar7;
  archive *in_stack_ffffffffffffff50;
  wchar_t wVar8;
  char *in_stack_ffffffffffffff58;
  archive_entry *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar9;
  archive *_a;
  char *e2;
  wchar_t utf8;
  uint in_stack_ffffffffffffff8c;
  uint uVar10;
  char *in_stack_ffffffffffffff90;
  void *_v1;
  wchar_t line;
  char *file_00;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  
  _v1 = (void *)0x6165725f74736574;
  line = L'\x74616d72';
  file_00 = (char *)0x7261722e7261725f;
  _a = (archive *)0x7865742074736574;
  e2 = (char *)0x656d75636f642074;
  utf8 = L'\x0a0d746e';
  uVar10 = in_stack_ffffffffffffff8c & 0xffffff00;
  iVar9 = 0x14;
  extract_reference_file(in_stack_00000350);
  paVar1 = (archive_entry *)archive_read_new();
  assertion_assert((char *)in_stack_ffffffffffffff50,
                   (wchar_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
  archive_read_set_format((archive *)in_stack_ffffffffffffff68,(wchar_t)((ulong)paVar1 >> 0x20));
  assertion_assert((char *)in_stack_ffffffffffffff50,
                   (wchar_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
  archive_read_append_filter((archive *)CONCAT44(uVar10,utf8),(int)((ulong)e2 >> 0x20));
  assertion_assert((char *)in_stack_ffffffffffffff50,
                   (wchar_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
  archive_read_open_filename
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
  assertion_assert((char *)in_stack_ffffffffffffff50,
                   (wchar_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
  archive_read_next_header(in_stack_ffffffffffffff40,(archive_entry **)in_stack_ffffffffffffff38);
  assertion_assert((char *)in_stack_ffffffffffffff50,
                   (wchar_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
  uVar6 = (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  archive_entry_pathname(in_stack_ffffffffffffff38);
  pvVar4 = (void *)0x0;
  pcVar2 = (char *)((ulong)uVar6 << 0x20);
  assertion_equal_string
            ((char *)in_stack_ffffffffffffff68,(wchar_t)((ulong)paVar1 >> 0x20),
             in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             pcVar2,e2,utf8);
  archive_entry_mtime(in_stack_ffffffffffffff68);
  assertion_assert((char *)in_stack_ffffffffffffff50,
                   (wchar_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff48,pcVar2,pvVar4);
  archive_entry_ctime(in_stack_ffffffffffffff68);
  assertion_assert((char *)in_stack_ffffffffffffff50,
                   (wchar_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff48,pcVar2,pvVar4);
  archive_entry_atime(in_stack_ffffffffffffff68);
  assertion_assert((char *)in_stack_ffffffffffffff50,
                   (wchar_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff48,pcVar2,pvVar4);
  wVar8 = (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  archive_entry_size(in_stack_ffffffffffffff68);
  assertion_equal_int(in_stack_ffffffffffffff58,wVar8,(longlong)in_stack_ffffffffffffff48,pcVar2,0,
                      (char *)0x1c6cfd,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_entry_mode(in_stack_ffffffffffffff68);
  pvVar4 = (void *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff58,wVar8,(longlong)in_stack_ffffffffffffff48,pcVar2,0,
                      (char *)0x1c6d3a,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  file = (char *)(long)iVar9;
  archive_read_data(_a,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70),
                    (size_t)in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff48,pcVar2,pvVar4);
  paVar3 = (archive_entry *)(long)iVar9;
  paVar5 = (archive *)0x2e25e9;
  v2 = (char *)0x0;
  assertion_equal_mem(file_00,line,_v1,in_stack_ffffffffffffff90,(void *)CONCAT44(uVar10,utf8),e2,
                      in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0)
  ;
  archive_read_next_header(paVar5,(archive_entry **)paVar3);
  assertion_assert(file,(wchar_t)((ulong)v2 >> 0x20),(wchar_t)v2,(char *)paVar5,paVar3);
  archive_entry_pathname(paVar3);
  pvVar4 = (void *)0x0;
  pcVar2 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)in_stack_ffffffffffffff68,(wchar_t)((ulong)paVar1 >> 0x20),
             in_stack_ffffffffffffff58,file,v2,pcVar2,e2,utf8);
  archive_entry_mtime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)v2 >> 0x20),(wchar_t)v2,pcVar2,pvVar4);
  archive_entry_ctime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)v2 >> 0x20),(wchar_t)v2,pcVar2,pvVar4);
  archive_entry_atime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)v2 >> 0x20),(wchar_t)v2,pcVar2,pvVar4);
  archive_entry_size(in_stack_ffffffffffffff68);
  assertion_equal_int(in_stack_ffffffffffffff58,(wchar_t)((ulong)file >> 0x20),(longlong)v2,pcVar2,0
                      ,(char *)0x1c6f0c,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_entry_mode(in_stack_ffffffffffffff68);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff58,(wchar_t)((ulong)file >> 0x20),(longlong)v2,pcVar2,0
                      ,(char *)0x1c6f49,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_entry_symlink(paVar3);
  paVar5 = (archive *)((ulong)pcVar2 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)in_stack_ffffffffffffff68,(wchar_t)((ulong)paVar1 >> 0x20),
             in_stack_ffffffffffffff58,file,v2,(char *)paVar5,e2,utf8);
  archive_read_data(_a,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70),
                    (size_t)in_stack_ffffffffffffff68);
  paVar3 = paVar1;
  assertion_equal_int(in_stack_ffffffffffffff58,(wchar_t)((ulong)file >> 0x20),(longlong)v2,
                      (char *)paVar5,(longlong)paVar1,(char *)0x1c6fd6,
                      (void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_read_next_header(paVar5,(archive_entry **)paVar1);
  assertion_assert(file,(wchar_t)((ulong)v2 >> 0x20),(wchar_t)v2,(char *)paVar5,paVar1);
  archive_entry_pathname(paVar1);
  pvVar4 = (void *)0x0;
  pcVar7 = (char *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)in_stack_ffffffffffffff68,(wchar_t)((ulong)paVar3 >> 0x20),
             in_stack_ffffffffffffff58,file,v2,pcVar7,e2,utf8);
  archive_entry_mtime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)v2 >> 0x20),(wchar_t)v2,pcVar7,pvVar4);
  archive_entry_ctime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)v2 >> 0x20),(wchar_t)v2,pcVar7,pvVar4);
  archive_entry_atime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)v2 >> 0x20),(wchar_t)v2,pcVar7,pvVar4);
  archive_entry_size(in_stack_ffffffffffffff68);
  assertion_equal_int(in_stack_ffffffffffffff58,(wchar_t)((ulong)file >> 0x20),(longlong)v2,pcVar7,0
                      ,(char *)0x1c710d,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_entry_mode(in_stack_ffffffffffffff68);
  pvVar4 = (void *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff58,(wchar_t)((ulong)file >> 0x20),(longlong)v2,pcVar7,0
                      ,(char *)0x1c714a,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  pcVar2 = (char *)(long)iVar9;
  archive_read_data(_a,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70),
                    (size_t)in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)v2 >> 0x20),(wchar_t)v2,pcVar7,pvVar4);
  paVar1 = (archive_entry *)(long)iVar9;
  paVar5 = (archive *)0x2e25e9;
  pcVar7 = (char *)0x0;
  assertion_equal_mem(file_00,line,_v1,in_stack_ffffffffffffff90,(void *)CONCAT44(uVar10,utf8),e2,
                      in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0)
  ;
  archive_read_next_header(paVar5,(archive_entry **)paVar1);
  assertion_assert(file,(wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,(char *)paVar5,paVar1);
  archive_entry_pathname(paVar1);
  pvVar4 = (void *)0x0;
  paVar5 = (archive *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)in_stack_ffffffffffffff68,(wchar_t)((ulong)paVar3 >> 0x20),pcVar2,file,pcVar7,
             (char *)paVar5,e2,utf8);
  archive_entry_mtime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,(char *)paVar5,pvVar4);
  archive_entry_ctime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,(char *)paVar5,pvVar4);
  archive_entry_atime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,(char *)paVar5,pvVar4);
  archive_entry_size(in_stack_ffffffffffffff68);
  assertion_equal_int(pcVar2,(wchar_t)((ulong)file >> 0x20),(longlong)pcVar7,(char *)paVar5,0,
                      (char *)0x1c731c,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_entry_mode(in_stack_ffffffffffffff68);
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int(pcVar2,(wchar_t)((ulong)file >> 0x20),(longlong)pcVar7,(char *)paVar5,0,
                      (char *)0x1c7359,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_read_next_header(paVar5,(archive_entry **)paVar1);
  assertion_assert(file,(wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,(char *)paVar5,paVar1);
  archive_entry_pathname(paVar1);
  pvVar4 = (void *)0x0;
  paVar5 = (archive *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)in_stack_ffffffffffffff68,(wchar_t)((ulong)paVar3 >> 0x20),pcVar2,file,pcVar7,
             (char *)paVar5,e2,utf8);
  archive_entry_mtime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,(char *)paVar5,pvVar4);
  archive_entry_ctime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,(char *)paVar5,pvVar4);
  archive_entry_atime(in_stack_ffffffffffffff68);
  assertion_assert(file,(wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,(char *)paVar5,pvVar4);
  archive_entry_size(in_stack_ffffffffffffff68);
  assertion_equal_int(pcVar2,(wchar_t)((ulong)file >> 0x20),(longlong)pcVar7,(char *)paVar5,0,
                      (char *)0x1c748d,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_entry_mode(in_stack_ffffffffffffff68);
  entry = (archive_entry **)0x0;
  assertion_equal_int(pcVar2,(wchar_t)((ulong)file >> 0x20),(longlong)pcVar7,(char *)paVar5,0,
                      (char *)0x1c74ca,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_read_next_header(paVar5,entry);
  assertion_assert(file,(wchar_t)((ulong)pcVar7 >> 0x20),(wchar_t)pcVar7,(char *)paVar5,entry);
  wVar8 = (wchar_t)((ulong)file >> 0x20);
  archive_file_count((archive *)paVar3);
  assertion_equal_int(pcVar2,wVar8,(longlong)pcVar7,(char *)paVar5,0,(char *)0x1c7542,
                      (void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_read_close((archive *)0x1c754c);
  assertion_equal_int(pcVar2,wVar8,(longlong)pcVar7,(char *)paVar5,(longlong)paVar3,(char *)0x1c757b
                      ,(void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  archive_read_free((archive *)0x1c7585);
  assertion_equal_int(pcVar2,wVar8,(longlong)pcVar7,(char *)paVar5,0,(char *)0x1c75b3,
                      (void *)CONCAT44(iVar9,in_stack_ffffffffffffff70));
  return;
}

Assistant:

DEFINE_TEST(test_read_set_format)
{
  char buff[64];
  const char reffile[] = "test_read_format_rar.rar";
  const char test_txt[] = "test text document\r\n";
  int size = sizeof(test_txt)-1;
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_file(reffile);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_RAR));
  assertA(0 == archive_read_append_filter(a, ARCHIVE_FILTER_NONE));
  assertA(0 == archive_read_open_filename(a, reffile, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(20, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertA(size == archive_read_data(a, buff, size));
  assertEqualMem(buff, test_txt, size);

  /* Second header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testlink", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(41471, archive_entry_mode(ae));
  assertEqualString("test.txt", archive_entry_symlink(ae));
  assertEqualIntA(a, 0, archive_read_data(a, buff, sizeof(buff)));

  /* Third header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir/test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(20, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertA(size == archive_read_data(a, buff, size));
  assertEqualMem(buff, test_txt, size);

  /* Fourth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));

  /* Fifth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testemptydir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(5, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}